

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

void __thiscall xray_re::xr_surface::~xr_surface(xr_surface *this)

{
  xr_surface *this_local;
  
  this->_vptr_xr_surface = (_func_int **)&PTR__xr_surface_0038e2a0;
  std::__cxx11::string::~string((string *)&this->m_vmap);
  std::__cxx11::string::~string((string *)&this->m_texture);
  std::__cxx11::string::~string((string *)&this->m_gamemtl);
  std::__cxx11::string::~string((string *)&this->m_cshader);
  std::__cxx11::string::~string((string *)&this->m_eshader);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

xr_surface::~xr_surface() {}